

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O1

void cmExtraEclipseCDT4Generator::AppendLinkedResource
               (cmGeneratedFileStream *fout,string *name,string *path,LinkType linkType)

{
  ostream *poVar1;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  string local_70;
  string local_50;
  
  pcVar2 = "location";
  if (linkType == VirtualFolder) {
    pcVar2 = "locationURI";
  }
  pcVar3 = "2";
  if (linkType == LinkToFile) {
    pcVar3 = "1";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)fout,"\t\t<link>\n\t\t\t<name>",0x12);
  EscapeForXML(&local_50,name);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)fout,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"</name>\n\t\t\t<type>",0x11);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar3,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"</type>\n\t\t\t<",0xc);
  lVar4 = (ulong)(linkType == VirtualFolder) * 3 + 8;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar2,lVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,">",1);
  EscapeForXML(&local_70,path);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"</",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar2,lVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,">\n\t\t</link>\n",0xc);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator
::AppendLinkedResource (cmGeneratedFileStream& fout,
                        const std::string&     name,
                        const std::string&     path,
                        LinkType linkType)
{
  const char* locationTag = "location";
  const char* typeTag = "2";
  if (linkType == VirtualFolder) // ... and not a linked folder
    {
    locationTag = "locationURI";
    }
  if (linkType == LinkToFile)
    {
    typeTag = "1";
    }

  fout <<
    "\t\t<link>\n"
    "\t\t\t<name>"
    << cmExtraEclipseCDT4Generator::EscapeForXML(name)
    << "</name>\n"
    "\t\t\t<type>" << typeTag << "</type>\n"
    "\t\t\t<" << locationTag << ">"
    << cmExtraEclipseCDT4Generator::EscapeForXML(path)
    << "</" << locationTag << ">\n"
    "\t\t</link>\n"
    ;
}